

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int set_sort(lyxp_set *set)

{
  undefined8 *puVar1;
  lyd_node_inner *plVar2;
  lyd_node_inner *plVar3;
  undefined8 uVar4;
  bool bVar5;
  LY_ERR LVar6;
  uint uVar7;
  int iVar8;
  uint32_t uVar9;
  lyxp_set_node *plVar10;
  lyd_node_inner *plVar11;
  uint uVar12;
  uint uVar13;
  lyxp_set_node *plVar14;
  bool bVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  lyxp_set_hash_node hnode;
  lyxp_set_node item;
  undefined8 local_58;
  undefined4 local_50 [2];
  lyd_node *local_48;
  undefined8 uStack_40;
  
  iVar8 = 0;
  if ((set->type == LYXP_SET_NODE_SET) && (iVar8 = 0, 1 < set->used)) {
    plVar11 = (lyd_node_inner *)set->tree;
    do {
      plVar2 = (plVar11->field_0).node.parent;
      plVar3 = plVar11;
      plVar11 = plVar2;
    } while (plVar2 != (lyd_node_inner *)0x0);
    do {
      plVar11 = plVar3;
      plVar3 = (lyd_node_inner *)(plVar11->field_0).node.prev;
    } while ((plVar3->field_0).node.next != (lyd_node *)0x0);
    LVar6 = set_assign_pos(set,(lyd_node *)plVar11,set->root_type);
    iVar8 = -1;
    if (LVar6 == LY_SUCCESS) {
      ly_log_dbg(2,"SORT BEGIN");
      print_set_debug(set);
      uVar7 = set->used;
      uVar13 = 0;
      if (uVar7 != 0) {
        uVar12 = 0;
LAB_001a7d0e:
        if (1 < uVar7 - uVar12) {
          bVar15 = true;
          uVar17 = 1;
          bVar18 = false;
          bVar5 = false;
LAB_001a7d25:
          lVar16 = uVar17 << 4;
          do {
            plVar14 = (lyxp_set_node *)((long)&(set->val).nodes[-1].node + lVar16);
            plVar10 = (lyxp_set_node *)((long)&((set->val).nodes)->node + lVar16);
            if (bVar5) {
              iVar8 = set_sort_compare(plVar10,plVar14);
              if (iVar8 < 0) goto LAB_001a7d79;
            }
            else {
              iVar8 = set_sort_compare(plVar14,plVar10);
              if (0 < iVar8) goto LAB_001a7d79;
            }
            bVar18 = bVar18 == false;
            uVar17 = uVar17 + 1;
            uVar7 = set->used;
            lVar16 = lVar16 + 0x10;
            bVar5 = bVar18;
            if (uVar7 - uVar12 <= uVar17) {
              uVar13 = uVar12 + 1;
              if (bVar15) goto LAB_001a7dd3;
              goto LAB_001a7dc7;
            }
          } while( true );
        }
        uVar13 = uVar12 + 1;
      }
LAB_001a7dd3:
      ly_log_dbg(2,"SORT END %d",(ulong)uVar13);
      print_set_debug(set);
      if (3 < set->used) {
        if (set->ht == (ly_ht *)0x0) {
          __assert_fail("set->ht",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                        ,0x720,"int set_sort(struct lyxp_set *)");
        }
        lVar16 = 8;
        uVar17 = 0;
        do {
          local_58 = *(undefined8 *)((long)(set->val).nodes + lVar16 + -8);
          local_50[0] = *(undefined4 *)((long)&((set->val).nodes)->node + lVar16);
          uVar9 = lyht_hash_multi(0,(char *)&local_58,8);
          uVar9 = lyht_hash_multi(uVar9,(char *)local_50,4);
          uVar9 = lyht_hash_multi(uVar9,(char *)0x0,0);
          LVar6 = lyht_find(set->ht,&local_58,uVar9,(void **)0x0);
          if (LVar6 != LY_SUCCESS) {
            __assert_fail("!lyht_find(set->ht, &hnode, hash, NULL)",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                          ,0x729,"int set_sort(struct lyxp_set *)");
          }
          uVar17 = uVar17 + 1;
          lVar16 = lVar16 + 0x10;
        } while (uVar17 < set->used);
      }
      iVar8 = uVar13 - 1;
    }
  }
  return iVar8;
LAB_001a7d79:
  plVar14 = (set->val).nodes;
  plVar10 = plVar14 + (uVar17 - 1);
  local_48 = plVar10->node;
  uStack_40._0_4_ = plVar10->type;
  uStack_40._4_4_ = plVar10->pos;
  puVar1 = (undefined8 *)((long)&plVar14->node + lVar16);
  uVar4 = puVar1[1];
  plVar14 = plVar14 + (uVar17 - 1);
  plVar14->node = (lyd_node *)*puVar1;
  plVar14->type = (int)uVar4;
  plVar14->pos = (int)((ulong)uVar4 >> 0x20);
  puVar1 = (undefined8 *)((long)&((set->val).nodes)->node + lVar16);
  *puVar1 = local_48;
  puVar1[1] = uStack_40;
  uVar17 = uVar17 + 1;
  uVar7 = set->used;
  bVar15 = false;
  if (uVar7 - uVar12 <= uVar17) goto LAB_001a7dc7;
  goto LAB_001a7d25;
LAB_001a7dc7:
  uVar12 = uVar12 + 1;
  uVar13 = uVar12;
  if (uVar7 <= uVar12) goto LAB_001a7dd3;
  goto LAB_001a7d0e;
}

Assistant:

static int
set_sort(struct lyxp_set *set)
{
    uint32_t i, j;
    int ret = 0, cmp;
    ly_bool inverted, change;
    const struct lyd_node *root;
    struct lyxp_set_node item;
    struct lyxp_set_hash_node hnode;
    uint64_t hash;

    if ((set->type != LYXP_SET_NODE_SET) || (set->used < 2)) {
        return 0;
    }

    /* find first top-level node to be used as anchor for positions */
    for (root = set->tree; root->parent; root = lyd_parent(root)) {}
    for ( ; root->prev->next; root = root->prev) {}

    /* fill positions */
    if (set_assign_pos(set, root, set->root_type)) {
        return -1;
    }

#ifndef NDEBUG
    LOGDBG(LY_LDGXPATH, "SORT BEGIN");
    print_set_debug(set);
#endif

    for (i = 0; i < set->used; ++i) {
        inverted = 0;
        change = 0;

        for (j = 1; j < set->used - i; ++j) {
            /* compare node positions */
            if (inverted) {
                cmp = set_sort_compare(&set->val.nodes[j], &set->val.nodes[j - 1]);
            } else {
                cmp = set_sort_compare(&set->val.nodes[j - 1], &set->val.nodes[j]);
            }

            /* swap if needed */
            if ((inverted && (cmp < 0)) || (!inverted && (cmp > 0))) {
                change = 1;

                item = set->val.nodes[j - 1];
                set->val.nodes[j - 1] = set->val.nodes[j];
                set->val.nodes[j] = item;
            } else {
                /* whether node_pos1 should be smaller than node_pos2 or the other way around */
                inverted = !inverted;
            }
        }

        ++ret;

        if (!change) {
            break;
        }
    }

#ifndef NDEBUG
    LOGDBG(LY_LDGXPATH, "SORT END %d", ret);
    print_set_debug(set);
#endif

    /* check node hashes */
    if (set->used >= LYD_HT_MIN_ITEMS) {
        assert(set->ht);
        for (i = 0; i < set->used; ++i) {
            hnode.node = set->val.nodes[i].node;
            hnode.type = set->val.nodes[i].type;

            hash = lyht_hash_multi(0, (const char *)&hnode.node, sizeof hnode.node);
            hash = lyht_hash_multi(hash, (const char *)&hnode.type, sizeof hnode.type);
            hash = lyht_hash_multi(hash, NULL, 0);

            assert(!lyht_find(set->ht, &hnode, hash, NULL));
        }
    }

    return ret - 1;
}